

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void malloc_conf_init_helper
               (sc_data_t *sc_data,uint *bin_shard_sizes,_Bool initial_call,char **opts_cache,
               char *buf)

{
  bool bVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  percpu_arena_mode_t *ppVar7;
  int *piVar8;
  uintmax_t uVar9;
  _Bool *p_Var10;
  char *pcVar11;
  size_t *psVar12;
  ssize_t *psVar13;
  undefined7 in_register_00000011;
  char *unaff_RBX;
  char *pcVar14;
  metadata_thp_mode_t mVar15;
  ulong uVar16;
  ulong uVar17;
  char *unaff_R13;
  char *pcVar18;
  bool bVar19;
  char *end;
  size_t vlen_left;
  size_t nshards;
  size_t size_end;
  size_t size_start;
  char *local_98;
  byte local_8d;
  undefined4 local_8c;
  char *local_88;
  ulong local_80;
  int local_78;
  undefined4 uStack_74;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  char *local_58;
  char **local_50;
  sc_data_t *local_48;
  char *local_40;
  uint *local_38;
  
  local_8c = (undefined4)CONCAT71(in_register_00000011,initial_call);
  local_8d = !initial_call;
  uVar17 = 0;
  local_50 = opts_cache;
  local_48 = sc_data;
  local_40 = buf;
  local_38 = bin_shard_sizes;
  do {
    if ((char)local_8c != '\0') {
      (*(code *)((long)&DAT_0014da48 + (long)(int)(&DAT_0014da48)[uVar17 & 0xffffffff]))();
      return;
    }
    pcVar18 = local_50[uVar17];
    local_80 = uVar17;
    if (opt_confirm_conf == true) {
      pcVar11 = pcVar18;
      if (pcVar18 == (char *)0x0) {
        pcVar11 = "";
      }
      malloc_printf("<jemalloc>: malloc_conf #%u (%s): \"%s\"\n",(ulong)((int)uVar17 + 1),
                    malloc_conf_init_helper_opts_explain_rel +
                    *(int *)(malloc_conf_init_helper_opts_explain_rel + uVar17 * 4),pcVar11);
    }
    if (pcVar18 != (char *)0x0) {
LAB_00139273:
      while (pcVar11 = pcVar18, *pcVar11 != '\0') {
        bVar19 = false;
        pcVar18 = pcVar11;
        do {
          switch(*pcVar18) {
          default:
            malloc_write("<jemalloc>: Malformed conf string\n");
            pcVar18 = pcVar11;
            goto LAB_0013930e;
          case '0':
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
          case 'A':
          case 'B':
          case 'C':
          case 'D':
          case 'E':
          case 'F':
          case 'G':
          case 'H':
          case 'I':
          case 'J':
          case 'K':
          case 'L':
          case 'M':
          case 'N':
          case 'O':
          case 'P':
          case 'Q':
          case 'R':
          case 'S':
          case 'T':
          case 'U':
          case 'V':
          case 'W':
          case 'X':
          case 'Y':
          case 'Z':
          case '_':
          case 'a':
          case 'b':
          case 'c':
          case 'd':
          case 'e':
          case 'f':
          case 'g':
          case 'h':
          case 'i':
          case 'j':
          case 'k':
          case 'l':
          case 'm':
          case 'n':
          case 'o':
          case 'p':
          case 'q':
          case 'r':
          case 's':
          case 't':
          case 'u':
          case 'v':
          case 'w':
          case 'x':
          case 'y':
          case 'z':
            break;
          case ':':
            unaff_R13 = pcVar18 + ~(ulong)pcVar11 + 1;
            buf = pcVar18 + 1;
            bVar19 = true;
          }
          pcVar18 = pcVar18 + 1;
        } while (!bVar19);
        bVar1 = false;
        do {
          if (*pcVar18 == '\0') {
            unaff_RBX = pcVar18 + -(long)buf;
LAB_001392fe:
            bVar1 = true;
          }
          else {
            if (*pcVar18 == ',') {
              if (pcVar18[1] == '\0') {
                malloc_write("<jemalloc>: Conf string ends with comma\n");
              }
              pcVar18 = pcVar18 + 1;
              unaff_RBX = pcVar18 + ~(ulong)buf;
              goto LAB_001392fe;
            }
            pcVar18 = pcVar18 + 1;
          }
        } while (!bVar1);
LAB_0013930e:
        if (!bVar19) break;
        if ((unaff_R13 != (char *)0xc) || (iVar4 = strncmp("confirm_conf",pcVar11,0xc), iVar4 != 0))
        goto LAB_00139342;
        if (unaff_RBX == (char *)0x5) {
          iVar4 = strncmp("false",buf,5);
          if (iVar4 != 0) goto LAB_001396b5;
          opt_confirm_conf = false;
          bVar2 = 1;
        }
        else if ((unaff_RBX == (char *)0x4) && (iVar4 = strncmp("true",buf,4), iVar4 == 0)) {
          opt_confirm_conf = true;
          bVar2 = 1;
        }
        else {
LAB_001396b5:
          bVar2 = 1;
          if ((char)local_8c == '\0') {
            malloc_conf_error("Invalid conf value",pcVar11,0xc,buf,(size_t)unaff_RBX);
            bVar2 = 0;
          }
        }
        if ((bVar2 & opt_confirm_conf & local_8d) == 1) {
          uVar17 = 0xc;
          goto LAB_0013a585;
        }
      }
      if ((opt_abort_conf == true) && (had_conf_error == '\x01')) {
        malloc_printf("<jemalloc>: Abort (abort_conf:true) on invalid conf value (see above).\n");
        abort();
      }
    }
    uVar17 = local_80 + 1;
    if (uVar17 == 4) {
      log_init_done.repr = true;
      return;
    }
  } while( true );
LAB_00139342:
  if ((char)local_8c != '\0') goto LAB_00139273;
  if ((unaff_R13 != (char *)0x5) || (iVar4 = strncmp("abort",pcVar11,5), iVar4 != 0)) {
    if ((unaff_R13 == (char *)0xa) && (iVar4 = strncmp("abort_conf",pcVar11,10), iVar4 == 0)) {
      if (unaff_RBX == (char *)0x5) {
        iVar4 = strncmp("false",buf,5);
        if (iVar4 == 0) {
          opt_abort_conf = false;
          goto LAB_00139bf6;
        }
LAB_00139807:
        malloc_conf_error("Invalid conf value",pcVar11,10,buf,(size_t)unaff_RBX);
        bVar19 = false;
      }
      else {
        if ((unaff_RBX != (char *)0x4) || (iVar4 = strncmp("true",buf,4), iVar4 != 0))
        goto LAB_00139807;
        opt_abort_conf = true;
LAB_00139bf6:
        bVar19 = true;
      }
      if ((!bVar19) || (opt_confirm_conf == false)) goto LAB_00139273;
    }
    else {
      iVar4 = strncmp("metadata_thp",pcVar11,(size_t)unaff_R13);
      if (iVar4 == 0) {
        iVar4 = strncmp(metadata_thp_mode_names[0],buf,(size_t)unaff_RBX);
        if (iVar4 == 0) {
          bVar19 = true;
          uVar17 = 0;
        }
        else {
          uVar17 = 0;
          do {
            uVar16 = uVar17;
            if (uVar16 == 2) goto LAB_00139e68;
            iVar4 = strncmp(metadata_thp_mode_names[uVar16 + 1],buf,(size_t)unaff_RBX);
            uVar17 = uVar16 + 1;
          } while (iVar4 != 0);
          bVar19 = uVar16 < 2;
        }
        mVar15 = (metadata_thp_mode_t)uVar17;
        ppVar7 = &opt_metadata_thp;
LAB_001398bf:
        *ppVar7 = mVar15;
        goto joined_r0x00139e8d;
      }
      if ((unaff_R13 == (char *)0x6) && (iVar4 = strncmp("retain",pcVar11,6), iVar4 == 0)) {
        if (unaff_RBX == (char *)0x5) {
          iVar4 = strncmp("false",buf,5);
          if (iVar4 != 0) goto LAB_00139918;
          p_Var10 = &opt_retain;
LAB_00139e05:
          *p_Var10 = false;
LAB_00139f1c:
          bVar19 = true;
        }
        else {
          if ((unaff_RBX == (char *)0x4) && (iVar4 = strncmp("true",buf,4), iVar4 == 0)) {
            p_Var10 = &opt_retain;
LAB_00139f19:
            *p_Var10 = true;
            goto LAB_00139f1c;
          }
LAB_00139918:
          malloc_conf_error("Invalid conf value",pcVar11,(size_t)unaff_R13,buf,(size_t)unaff_RBX);
          bVar19 = false;
        }
        if ((!bVar19) || (opt_confirm_conf == false)) goto LAB_00139273;
        uVar17 = 6;
        goto LAB_0013a585;
      }
      iVar4 = strncmp("dss",pcVar11,(size_t)unaff_R13);
      if (iVar4 == 0) {
        bVar2 = 1;
        lVar6 = 0;
        do {
          iVar4 = strncmp(dss_prec_names[lVar6],buf,(size_t)unaff_RBX);
          if (iVar4 == 0) {
            _Var3 = extent_dss_prec_set((dss_prec_t)lVar6);
            if (!_Var3) {
              opt_dss = dss_prec_names[lVar6];
              goto LAB_00139a21;
            }
            malloc_conf_error("Error setting dss",pcVar11,(size_t)unaff_R13,buf,(size_t)unaff_RBX);
            bVar2 = 0;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        malloc_conf_error("Invalid conf value",pcVar11,(size_t)unaff_R13,buf,(size_t)unaff_RBX);
        bVar2 = 0;
LAB_00139a21:
        bVar2 = bVar2 & opt_confirm_conf;
LAB_00139a33:
        if (bVar2 != 1) goto LAB_00139273;
        uVar17 = (ulong)unaff_R13 & 0xffffffff;
        goto LAB_0013a585;
      }
      if ((unaff_R13 == (char *)0x7) && (iVar4 = strncmp("narenas",pcVar11,7), iVar4 == 0)) {
        piVar8 = __errno_location();
        *piVar8 = 0;
        uVar9 = malloc_strtoumax(buf,&local_98,0);
        if ((*piVar8 == 0) && (local_98 + -(long)buf == unaff_RBX)) {
          if (uVar9 == 0) {
            pcVar14 = "Out-of-range conf value";
            goto LAB_00139af5;
          }
          opt_narenas = (uint)uVar9;
          bVar19 = true;
        }
        else {
          pcVar14 = "Invalid conf value";
LAB_00139af5:
          malloc_conf_error(pcVar14,pcVar11,7,buf,(size_t)unaff_RBX);
          bVar19 = false;
        }
        if ((!bVar19) || (opt_confirm_conf == false)) goto LAB_00139273;
        uVar17 = 7;
        goto LAB_0013a585;
      }
      if ((unaff_R13 != (char *)0xa) || (iVar4 = strncmp("bin_shards",pcVar11,10), iVar4 != 0)) {
        if (unaff_R13 == (char *)0xe) {
          iVar4 = strncmp("dirty_decay_ms",pcVar11,0xe);
          if (iVar4 == 0) {
            piVar8 = __errno_location();
            *piVar8 = 0;
            lVar6 = strtol(buf,&local_98,0);
            if ((*piVar8 != 0) || (local_98 + -(long)buf != unaff_RBX)) {
LAB_00139faa:
              pcVar14 = "Invalid conf value";
              goto LAB_00139fb6;
            }
            if (lVar6 - 0x10c6f7a0af41U < 0xffffef39085f50be) goto LAB_00139fa1;
            psVar13 = &opt_dirty_decay_ms;
LAB_0013a4ab:
            *psVar13 = lVar6;
            bVar19 = true;
          }
          else {
            iVar4 = strncmp("muzzy_decay_ms",pcVar11,0xe);
            if (iVar4 != 0) goto LAB_0013946f;
            piVar8 = __errno_location();
            *piVar8 = 0;
            lVar6 = strtol(buf,&local_98,0);
            if ((*piVar8 != 0) || (local_98 + -(long)buf != unaff_RBX)) goto LAB_00139faa;
            if (0xffffef39085f50bd < lVar6 - 0x10c6f7a0af41U) {
              psVar13 = &opt_muzzy_decay_ms;
              goto LAB_0013a4ab;
            }
LAB_00139fa1:
            pcVar14 = "Out-of-range conf value";
LAB_00139fb6:
            malloc_conf_error(pcVar14,pcVar11,0xe,buf,(size_t)unaff_RBX);
            bVar19 = false;
          }
          if ((!bVar19) || (opt_confirm_conf == false)) goto LAB_00139273;
          uVar17 = 0xe;
          goto LAB_0013a585;
        }
LAB_0013946f:
        if (unaff_R13 == (char *)0x10) {
          iVar4 = strncmp("stats_print_opts",pcVar11,0x10);
          if (iVar4 == 0) {
            bVar2 = opt_confirm_conf;
            if (unaff_RBX != (char *)0x0) {
              local_60 = strlen(opt_stats_print_opts);
              pcVar14 = (char *)0x0;
              local_58 = unaff_R13;
              do {
                bVar2 = buf[(long)pcVar14];
                if (((bVar2 - 0x4a < 0x2f) &&
                    ((0x400c2d800001U >> ((ulong)(bVar2 - 0x4a) & 0x3f) & 1) != 0)) &&
                   (pcVar5 = strchr(opt_stats_print_opts,(int)(char)bVar2), unaff_R13 = local_58,
                   pcVar5 == (char *)0x0)) {
                  opt_stats_print_opts[local_60] = bVar2;
                  opt_stats_print_opts[local_60 + 1] = '\0';
                  local_60 = local_60 + 1;
                }
                pcVar14 = pcVar14 + 1;
                bVar2 = opt_confirm_conf;
              } while (unaff_RBX != pcVar14);
            }
            goto LAB_00139a33;
          }
LAB_001394b9:
          if (unaff_R13 == (char *)0x4) {
            iVar4 = strncmp("junk",pcVar11,4);
            if (iVar4 == 0) {
              if ((unaff_RBX == (char *)0x4) && (iVar4 = strncmp("true",buf,4), iVar4 == 0)) {
                opt_junk = "true";
                bVar19 = true;
                opt_junk_free = true;
                opt_junk_alloc = true;
              }
              else {
                if (unaff_RBX == (char *)0x5) {
                  iVar4 = strncmp("false",buf,5);
                  if (iVar4 == 0) {
                    opt_junk = "false";
                    opt_junk_free = false;
                    opt_junk_alloc = false;
                    bVar19 = true;
                    goto LAB_0013a55e;
                  }
                  iVar4 = strncmp("alloc",buf,5);
                  if (iVar4 != 0) goto LAB_00139d36;
                  opt_junk = "alloc";
                  opt_junk_alloc = true;
                  opt_junk_free = false;
                }
                else {
LAB_00139d36:
                  if ((unaff_RBX != (char *)0x4) || (iVar4 = strncmp("free",buf,4), iVar4 != 0)) {
                    malloc_conf_error("Invalid conf value",pcVar11,4,buf,(size_t)unaff_RBX);
                    goto LAB_0013a11f;
                  }
                  opt_junk = "free";
                  opt_junk_alloc = false;
                  opt_junk_free = true;
                }
                bVar19 = true;
              }
            }
            else {
              iVar4 = strncmp("zero",pcVar11,4);
              if (iVar4 != 0) goto LAB_001394fd;
              if (unaff_RBX == (char *)0x5) {
                iVar4 = strncmp("false",buf,5);
                if (iVar4 == 0) {
                  opt_zero = false;
                  goto LAB_0013a558;
                }
              }
              else if ((unaff_RBX == (char *)0x4) && (iVar4 = strncmp("true",buf,4), iVar4 == 0)) {
                opt_zero = true;
LAB_0013a558:
                bVar19 = true;
                goto LAB_0013a55e;
              }
              malloc_conf_error("Invalid conf value",pcVar11,4,buf,(size_t)unaff_RBX);
LAB_0013a11f:
              bVar19 = false;
            }
LAB_0013a55e:
            if ((!bVar19) || (opt_confirm_conf == false)) goto LAB_00139273;
            uVar17 = 4;
            goto LAB_0013a585;
          }
LAB_001394fd:
          if ((unaff_R13 == (char *)0x6) && (iVar4 = strncmp("tcache",pcVar11,6), iVar4 == 0)) {
            if (unaff_RBX == (char *)0x5) {
              iVar4 = strncmp("false",buf,5);
              if (iVar4 == 0) {
                p_Var10 = &opt_tcache;
                goto LAB_00139e05;
              }
            }
            else if ((unaff_RBX == (char *)0x4) && (iVar4 = strncmp("true",buf,4), iVar4 == 0)) {
              p_Var10 = &opt_tcache;
              goto LAB_00139f19;
            }
            goto LAB_00139918;
          }
          if (unaff_R13 == (char *)0x18) {
            iVar4 = strncmp("lg_extent_max_active_fit",pcVar11,0x18);
            if (iVar4 == 0) {
              piVar8 = __errno_location();
              *piVar8 = 0;
              uVar9 = malloc_strtoumax(buf,&local_98,0);
              if ((*piVar8 == 0) && (local_98 + -(long)buf == unaff_RBX)) {
                if (uVar9 < 0x41) {
                  psVar12 = &opt_lg_extent_max_active_fit;
                  goto LAB_0013a5ab;
                }
LAB_0013a170:
                pcVar14 = "Out-of-range conf value";
              }
              else {
LAB_0013a179:
                pcVar14 = "Invalid conf value";
              }
LAB_0013a1a2:
              malloc_conf_error(pcVar14,pcVar11,(size_t)unaff_R13,buf,(size_t)unaff_RBX);
              bVar19 = false;
              goto joined_r0x00139e8d;
            }
          }
          else if (unaff_R13 == (char *)0x12) {
            iVar4 = strncmp("oversize_threshold",pcVar11,0x12);
            if (iVar4 == 0) {
              piVar8 = __errno_location();
              *piVar8 = 0;
              uVar9 = malloc_strtoumax(buf,&local_98,0);
              if ((*piVar8 == 0) && (local_98 + -(long)buf == unaff_RBX)) {
                if (uVar9 < 0x7000000000000001) {
                  psVar12 = &opt_oversize_threshold;
                  goto LAB_0013a5ab;
                }
                pcVar14 = "Out-of-range conf value";
              }
              else {
                pcVar14 = "Invalid conf value";
              }
              goto LAB_0013a1a2;
            }
          }
          else if ((unaff_R13 == (char *)0xd) &&
                  (iVar4 = strncmp("lg_tcache_max",pcVar11,0xd), iVar4 == 0)) {
            piVar8 = __errno_location();
            *piVar8 = 0;
            uVar9 = strtol(buf,&local_98,0);
            if ((*piVar8 == 0) && (local_98 + -(long)buf == unaff_RBX)) {
              if (uVar9 - 0x40 < 0xffffffffffffffbf) goto LAB_0013a170;
              psVar12 = (size_t *)&opt_lg_tcache_max;
LAB_0013a5ab:
              *psVar12 = uVar9;
              bVar19 = true;
              goto joined_r0x00139e8d;
            }
            goto LAB_0013a179;
          }
          iVar4 = strncmp("percpu_arena",pcVar11,(size_t)unaff_R13);
          if (iVar4 == 0) {
            iVar4 = strncmp(percpu_arena_mode_names[0],buf,(size_t)unaff_RBX);
            if (iVar4 == 0) {
              bVar19 = true;
              uVar17 = 0;
            }
            else {
              uVar17 = 0;
              do {
                uVar16 = uVar17;
                if (uVar16 == 2) goto LAB_00139e68;
                iVar4 = strncmp(percpu_arena_mode_names[uVar16 + 1],buf,(size_t)unaff_RBX);
                uVar17 = uVar16 + 1;
              } while (iVar4 != 0);
              bVar19 = uVar16 < 2;
            }
            mVar15 = (metadata_thp_mode_t)uVar17;
            ppVar7 = &opt_percpu_arena;
            goto LAB_001398bf;
          }
          if (unaff_R13 == (char *)0x16) {
            iVar4 = strncmp("max_background_threads",pcVar11,0x16);
            if (iVar4 == 0) {
              piVar8 = __errno_location();
              *piVar8 = 0;
              uVar9 = malloc_strtoumax(buf,&local_98,0);
              if ((*piVar8 == 0) && (local_98 + -(long)buf == unaff_RBX)) {
                if (uVar9 == 0) {
                  opt_max_background_threads = 1;
                  bVar19 = true;
                }
                else {
                  bVar19 = true;
                  if (uVar9 <= opt_max_background_threads) {
                    opt_max_background_threads = uVar9;
                  }
                }
              }
              else {
                malloc_conf_error("Invalid conf value",pcVar11,0x16,buf,(size_t)unaff_RBX);
                bVar19 = false;
              }
              goto joined_r0x00139e8d;
            }
          }
          else if ((unaff_R13 == (char *)0x11) &&
                  (iVar4 = strncmp("background_thread",pcVar11,0x11), iVar4 == 0)) {
            if (unaff_RBX == (char *)0x5) {
              iVar4 = strncmp("false",buf,5);
              if (iVar4 == 0) {
                opt_background_thread = false;
                goto LAB_0013a466;
              }
            }
            else if ((unaff_RBX == (char *)0x4) && (iVar4 = strncmp("true",buf,4), iVar4 == 0)) {
              p_Var10 = &opt_background_thread;
              goto LAB_0013a463;
            }
            malloc_conf_error("Invalid conf value",pcVar11,0x11,buf,(size_t)unaff_RBX);
            goto LAB_00139def;
          }
          if ((unaff_R13 == (char *)0xa) && (iVar4 = strncmp("slab_sizes",pcVar11,10), iVar4 == 0))
          {
            bVar19 = true;
            local_98 = buf;
            local_88 = unaff_RBX;
            do {
              _Var3 = malloc_conf_multi_sizes_next
                                (&local_98,(size_t *)&local_88,&local_68,&local_70,
                                 (size_t *)&local_78);
              if (_Var3) {
                malloc_conf_error("Invalid settings for slab_sizes",pcVar11,10,buf,(size_t)unaff_RBX
                                 );
                bVar19 = false;
              }
              else {
                sc_data_update_slab_size(local_48,local_68,local_70,local_78);
              }
            } while (!_Var3 && local_88 != (char *)0x0);
            if ((opt_confirm_conf != true) || (!bVar19)) goto LAB_00139273;
            uVar17 = 10;
          }
          else {
            if ((unaff_R13 != (char *)0x3) || (iVar4 = strncmp("thp",pcVar11,3), iVar4 != 0)) {
              malloc_conf_error("Invalid conf pair",pcVar11,(size_t)unaff_R13,buf,(size_t)unaff_RBX)
              ;
              goto LAB_00139273;
            }
            iVar4 = strncmp(thp_mode_names[0],buf,(size_t)unaff_RBX);
            if (iVar4 == 0) {
              bVar19 = true;
              uVar17 = 0;
            }
            else {
              uVar17 = 0;
              do {
                uVar16 = uVar17;
                bVar19 = uVar16 < 2;
                if (uVar16 == 2) {
                  malloc_conf_error("Invalid conf value",pcVar11,3,buf,(size_t)unaff_RBX);
                  goto LAB_0013a527;
                }
                iVar4 = strncmp(thp_mode_names[uVar16 + 1],buf,(size_t)unaff_RBX);
                uVar17 = uVar16 + 1;
              } while (iVar4 != 0);
              bVar19 = uVar16 < 2;
            }
            opt_thp = (thp_mode_t)uVar17;
LAB_0013a527:
            if ((!bVar19) || (opt_confirm_conf == false)) goto LAB_00139273;
            uVar17 = 3;
          }
          goto LAB_0013a585;
        }
        if ((unaff_R13 != (char *)0xb) || (iVar4 = strncmp("stats_print",pcVar11,0xb), iVar4 != 0))
        goto LAB_001394b9;
        if (unaff_RBX != (char *)0x5) {
          if ((unaff_RBX != (char *)0x4) || (iVar4 = strncmp("true",buf,4), iVar4 != 0))
          goto LAB_00139dd3;
          p_Var10 = &opt_stats_print;
LAB_0013a463:
          *p_Var10 = true;
LAB_0013a466:
          bVar19 = true;
          goto joined_r0x00139e8d;
        }
        iVar4 = strncmp("false",buf,5);
        if (iVar4 == 0) {
          opt_stats_print = false;
          bVar19 = true;
          goto joined_r0x00139e8d;
        }
LAB_00139dd3:
        malloc_conf_error("Invalid conf value",pcVar11,0xb,buf,(size_t)unaff_RBX);
LAB_00139def:
        bVar19 = false;
        goto joined_r0x00139e8d;
      }
      bVar19 = true;
      local_98 = buf;
      local_88 = unaff_RBX;
      do {
        _Var3 = malloc_conf_multi_sizes_next
                          (&local_98,(size_t *)&local_88,&local_68,&local_70,(size_t *)&local_78);
        if ((_Var3) ||
           (_Var3 = bin_update_shard_size(local_38,local_68,local_70,CONCAT44(uStack_74,local_78)),
           _Var3)) {
          malloc_conf_error("Invalid settings for bin_shards",pcVar11,10,buf,(size_t)unaff_RBX);
          bVar1 = true;
          bVar19 = false;
        }
        else {
          bVar1 = false;
        }
      } while ((!bVar1) && (local_88 != (char *)0x0));
      if ((opt_confirm_conf != true) || (!bVar19)) goto LAB_00139273;
    }
    uVar17 = 10;
    goto LAB_0013a585;
  }
  if (unaff_RBX == (char *)0x5) {
    iVar4 = strncmp("false",buf,5);
    if (iVar4 == 0) {
      opt_abort = false;
      goto LAB_00139bbd;
    }
LAB_00139790:
    malloc_conf_error("Invalid conf value",pcVar11,5,buf,(size_t)unaff_RBX);
    bVar19 = false;
  }
  else {
    if ((unaff_RBX != (char *)0x4) || (iVar4 = strncmp("true",buf,4), iVar4 != 0))
    goto LAB_00139790;
    opt_abort = true;
LAB_00139bbd:
    bVar19 = true;
  }
  if ((!bVar19) || (opt_confirm_conf == false)) goto LAB_00139273;
  uVar17 = 5;
LAB_0013a585:
  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",uVar17,pcVar11,
                (ulong)unaff_RBX & 0xffffffff,buf);
  goto LAB_00139273;
LAB_00139e68:
  bVar19 = uVar16 < 2;
  malloc_conf_error("Invalid conf value",pcVar11,(size_t)unaff_R13,buf,(size_t)unaff_RBX);
joined_r0x00139e8d:
  if ((!bVar19) || (opt_confirm_conf == false)) goto LAB_00139273;
  uVar17 = (ulong)unaff_R13 & 0xffffffff;
  goto LAB_0013a585;
}

Assistant:

static void
malloc_conf_init_helper(sc_data_t *sc_data, unsigned bin_shard_sizes[SC_NBINS],
    bool initial_call, const char *opts_cache[MALLOC_CONF_NSOURCES],
    char buf[PATH_MAX + 1]) {
	static const char *opts_explain[MALLOC_CONF_NSOURCES] = {
		"string specified via --with-malloc-conf",
		"string pointed to by the global variable malloc_conf",
		"\"name\" of the file referenced by the symbolic link named "
		    "/etc/malloc.conf",
		"value of the environment variable MALLOC_CONF"
	};
	unsigned i;
	const char *opts, *k, *v;
	size_t klen, vlen;

	for (i = 0; i < MALLOC_CONF_NSOURCES; i++) {
		/* Get runtime configuration. */
		if (initial_call) {
			opts_cache[i] = obtain_malloc_conf(i, buf);
		}
		opts = opts_cache[i];
		if (!initial_call && opt_confirm_conf) {
			malloc_printf(
			    "<jemalloc>: malloc_conf #%u (%s): \"%s\"\n",
			    i + 1, opts_explain[i], opts != NULL ? opts : "");
		}
		if (opts == NULL) {
			continue;
		}

		while (*opts != '\0' && !malloc_conf_next(&opts, &k, &klen, &v,
		    &vlen)) {

#define CONF_ERROR(msg, k, klen, v, vlen)				\
			if (!initial_call) {				\
				malloc_conf_error(			\
				    msg, k, klen, v, vlen);		\
				cur_opt_valid = false;			\
			}
#define CONF_CONTINUE	{						\
				if (!initial_call && opt_confirm_conf	\
				    && cur_opt_valid) {			\
					malloc_printf("<jemalloc>: Set "\
					    "conf value: %.*s:%.*s\n",	\
					    (int)klen, k, (int)vlen, v);\
				}					\
				continue;				\
			}
#define CONF_MATCH(n)							\
	(sizeof(n)-1 == klen && strncmp(n, k, klen) == 0)
#define CONF_MATCH_VALUE(n)						\
	(sizeof(n)-1 == vlen && strncmp(n, v, vlen) == 0)
#define CONF_HANDLE_BOOL(o, n)						\
			if (CONF_MATCH(n)) {				\
				if (CONF_MATCH_VALUE("true")) {		\
					o = true;			\
				} else if (CONF_MATCH_VALUE("false")) {	\
					o = false;			\
				} else {				\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				}					\
				CONF_CONTINUE;				\
			}
      /*
       * One of the CONF_MIN macros below expands, in one of the use points,
       * to "unsigned integer < 0", which is always false, triggering the
       * GCC -Wtype-limits warning, which we disable here and re-enable below.
       */
      JEMALLOC_DIAGNOSTIC_PUSH
      JEMALLOC_DIAGNOSTIC_IGNORE_TYPE_LIMITS

#define CONF_DONT_CHECK_MIN(um, min)	false
#define CONF_CHECK_MIN(um, min)	((um) < (min))
#define CONF_DONT_CHECK_MAX(um, max)	false
#define CONF_CHECK_MAX(um, max)	((um) > (max))
#define CONF_HANDLE_T_U(t, o, n, min, max, check_min, check_max, clip)	\
			if (CONF_MATCH(n)) {				\
				uintmax_t um;				\
				char *end;				\
									\
				set_errno(0);				\
				um = malloc_strtoumax(v, &end, 0);	\
				if (get_errno() != 0 || (uintptr_t)end -\
				    (uintptr_t)v != vlen) {		\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				} else if (clip) {			\
					if (check_min(um, (t)(min))) {	\
						o = (t)(min);		\
					} else if (			\
					    check_max(um, (t)(max))) {	\
						o = (t)(max);		\
					} else {			\
						o = (t)um;		\
					}				\
				} else {				\
					if (check_min(um, (t)(min)) ||	\
					    check_max(um, (t)(max))) {	\
						CONF_ERROR(		\
						    "Out-of-range "	\
						    "conf value",	\
						    k, klen, v, vlen);	\
					} else {			\
						o = (t)um;		\
					}				\
				}					\
				CONF_CONTINUE;				\
			}
#define CONF_HANDLE_UNSIGNED(o, n, min, max, check_min, check_max,	\
    clip)								\
			CONF_HANDLE_T_U(unsigned, o, n, min, max,	\
			    check_min, check_max, clip)
#define CONF_HANDLE_SIZE_T(o, n, min, max, check_min, check_max, clip)	\
			CONF_HANDLE_T_U(size_t, o, n, min, max,		\
			    check_min, check_max, clip)
#define CONF_HANDLE_SSIZE_T(o, n, min, max)				\
			if (CONF_MATCH(n)) {				\
				long l;					\
				char *end;				\
									\
				set_errno(0);				\
				l = strtol(v, &end, 0);			\
				if (get_errno() != 0 || (uintptr_t)end -\
				    (uintptr_t)v != vlen) {		\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				} else if (l < (ssize_t)(min) || l >	\
				    (ssize_t)(max)) {			\
					CONF_ERROR(			\
					    "Out-of-range conf value",	\
					    k, klen, v, vlen);		\
				} else {				\
					o = l;				\
				}					\
				CONF_CONTINUE;				\
			}
#define CONF_HANDLE_CHAR_P(o, n, d)					\
			if (CONF_MATCH(n)) {				\
				size_t cpylen = (vlen <=		\
				    sizeof(o)-1) ? vlen :		\
				    sizeof(o)-1;			\
				strncpy(o, v, cpylen);			\
				o[cpylen] = '\0';			\
				CONF_CONTINUE;				\
			}

			bool cur_opt_valid = true;

			CONF_HANDLE_BOOL(opt_confirm_conf, "confirm_conf")
			if (initial_call) {
				continue;
			}

			CONF_HANDLE_BOOL(opt_abort, "abort")
			CONF_HANDLE_BOOL(opt_abort_conf, "abort_conf")
			if (strncmp("metadata_thp", k, klen) == 0) {
				int i;
				bool match = false;
				for (i = 0; i < metadata_thp_mode_limit; i++) {
					if (strncmp(metadata_thp_mode_names[i],
					    v, vlen) == 0) {
						opt_metadata_thp = i;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_BOOL(opt_retain, "retain")
			if (strncmp("dss", k, klen) == 0) {
				int i;
				bool match = false;
				for (i = 0; i < dss_prec_limit; i++) {
					if (strncmp(dss_prec_names[i], v, vlen)
					    == 0) {
						if (extent_dss_prec_set(i)) {
							CONF_ERROR(
							    "Error setting dss",
							    k, klen, v, vlen);
						} else {
							opt_dss =
							    dss_prec_names[i];
							match = true;
							break;
						}
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_UNSIGNED(opt_narenas, "narenas", 1,
			    UINT_MAX, CONF_CHECK_MIN, CONF_DONT_CHECK_MAX,
			    false)
			if (CONF_MATCH("bin_shards")) {
				const char *bin_shards_segment_cur = v;
				size_t vlen_left = vlen;
				do {
					size_t size_start;
					size_t size_end;
					size_t nshards;
					bool err = malloc_conf_multi_sizes_next(
					    &bin_shards_segment_cur, &vlen_left,
					    &size_start, &size_end, &nshards);
					if (err || bin_update_shard_size(
					    bin_shard_sizes, size_start,
					    size_end, nshards)) {
						CONF_ERROR(
						    "Invalid settings for "
						    "bin_shards", k, klen, v,
						    vlen);
						break;
					}
				} while (vlen_left > 0);
				CONF_CONTINUE;
			}
			CONF_HANDLE_SSIZE_T(opt_dirty_decay_ms,
			    "dirty_decay_ms", -1, NSTIME_SEC_MAX * KQU(1000) <
			    QU(SSIZE_MAX) ? NSTIME_SEC_MAX * KQU(1000) :
			    SSIZE_MAX);
			CONF_HANDLE_SSIZE_T(opt_muzzy_decay_ms,
			    "muzzy_decay_ms", -1, NSTIME_SEC_MAX * KQU(1000) <
			    QU(SSIZE_MAX) ? NSTIME_SEC_MAX * KQU(1000) :
			    SSIZE_MAX);
			CONF_HANDLE_BOOL(opt_stats_print, "stats_print")
			if (CONF_MATCH("stats_print_opts")) {
				init_opt_stats_print_opts(v, vlen);
				CONF_CONTINUE;
			}
			if (config_fill) {
				if (CONF_MATCH("junk")) {
					if (CONF_MATCH_VALUE("true")) {
						opt_junk = "true";
						opt_junk_alloc = opt_junk_free =
						    true;
					} else if (CONF_MATCH_VALUE("false")) {
						opt_junk = "false";
						opt_junk_alloc = opt_junk_free =
						    false;
					} else if (CONF_MATCH_VALUE("alloc")) {
						opt_junk = "alloc";
						opt_junk_alloc = true;
						opt_junk_free = false;
					} else if (CONF_MATCH_VALUE("free")) {
						opt_junk = "free";
						opt_junk_alloc = false;
						opt_junk_free = true;
					} else {
						CONF_ERROR(
						    "Invalid conf value",
						    k, klen, v, vlen);
					}
					CONF_CONTINUE;
				}
				CONF_HANDLE_BOOL(opt_zero, "zero")
			}
			if (config_utrace) {
				CONF_HANDLE_BOOL(opt_utrace, "utrace")
			}
			if (config_xmalloc) {
				CONF_HANDLE_BOOL(opt_xmalloc, "xmalloc")
			}
			CONF_HANDLE_BOOL(opt_tcache, "tcache")
			CONF_HANDLE_SSIZE_T(opt_lg_tcache_max, "lg_tcache_max",
			    -1, (sizeof(size_t) << 3) - 1)

			/*
			 * The runtime option of oversize_threshold remains
			 * undocumented.  It may be tweaked in the next major
			 * release (6.0).  The default value 8M is rather
			 * conservative / safe.  Tuning it further down may
			 * improve fragmentation a bit more, but may also cause
			 * contention on the huge arena.
			 */
			CONF_HANDLE_SIZE_T(opt_oversize_threshold,
			    "oversize_threshold", 0, SC_LARGE_MAXCLASS,
			    CONF_DONT_CHECK_MIN, CONF_CHECK_MAX, false)
			CONF_HANDLE_SIZE_T(opt_lg_extent_max_active_fit,
			    "lg_extent_max_active_fit", 0,
			    (sizeof(size_t) << 3), CONF_DONT_CHECK_MIN,
			    CONF_CHECK_MAX, false)

			if (strncmp("percpu_arena", k, klen) == 0) {
				bool match = false;
				for (int i = percpu_arena_mode_names_base; i <
				    percpu_arena_mode_names_limit; i++) {
					if (strncmp(percpu_arena_mode_names[i],
					    v, vlen) == 0) {
						if (!have_percpu_arena) {
							CONF_ERROR(
							    "No getcpu support",
							    k, klen, v, vlen);
						}
						opt_percpu_arena = i;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_BOOL(opt_background_thread,
			    "background_thread");
			CONF_HANDLE_SIZE_T(opt_max_background_threads,
					   "max_background_threads", 1,
					   opt_max_background_threads,
					   CONF_CHECK_MIN, CONF_CHECK_MAX,
					   true);
			if (CONF_MATCH("slab_sizes")) {
				bool err;
				const char *slab_size_segment_cur = v;
				size_t vlen_left = vlen;
				do {
					size_t slab_start;
					size_t slab_end;
					size_t pgs;
					err = malloc_conf_multi_sizes_next(
					    &slab_size_segment_cur,
					    &vlen_left, &slab_start, &slab_end,
					    &pgs);
					if (!err) {
						sc_data_update_slab_size(
						    sc_data, slab_start,
						    slab_end, (int)pgs);
					} else {
						CONF_ERROR("Invalid settings "
						    "for slab_sizes",
						    k, klen, v, vlen);
					}
				} while (!err && vlen_left > 0);
				CONF_CONTINUE;
			}
			if (config_prof) {
				CONF_HANDLE_BOOL(opt_prof, "prof")
				CONF_HANDLE_CHAR_P(opt_prof_prefix,
				    "prof_prefix", "jeprof")
				CONF_HANDLE_BOOL(opt_prof_active, "prof_active")
				CONF_HANDLE_BOOL(opt_prof_thread_active_init,
				    "prof_thread_active_init")
				CONF_HANDLE_SIZE_T(opt_lg_prof_sample,
				    "lg_prof_sample", 0, (sizeof(uint64_t) << 3)
				    - 1, CONF_DONT_CHECK_MIN, CONF_CHECK_MAX,
				    true)
				CONF_HANDLE_BOOL(opt_prof_accum, "prof_accum")
				CONF_HANDLE_SSIZE_T(opt_lg_prof_interval,
				    "lg_prof_interval", -1,
				    (sizeof(uint64_t) << 3) - 1)
				CONF_HANDLE_BOOL(opt_prof_gdump, "prof_gdump")
				CONF_HANDLE_BOOL(opt_prof_final, "prof_final")
				CONF_HANDLE_BOOL(opt_prof_leak, "prof_leak")
				CONF_HANDLE_BOOL(opt_prof_log, "prof_log")
			}
			if (config_log) {
				if (CONF_MATCH("log")) {
					size_t cpylen = (
					    vlen <= sizeof(log_var_names) ?
					    vlen : sizeof(log_var_names) - 1);
					strncpy(log_var_names, v, cpylen);
					log_var_names[cpylen] = '\0';
					CONF_CONTINUE;
				}
			}
			if (CONF_MATCH("thp")) {
				bool match = false;
				for (int i = 0; i < thp_mode_names_limit; i++) {
					if (strncmp(thp_mode_names[i],v, vlen)
					    == 0) {
						if (!have_madvise_huge) {
							CONF_ERROR(
							    "No THP support",
							    k, klen, v, vlen);
						}
						opt_thp = i;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_ERROR("Invalid conf pair", k, klen, v, vlen);
#undef CONF_ERROR
#undef CONF_CONTINUE
#undef CONF_MATCH
#undef CONF_MATCH_VALUE
#undef CONF_HANDLE_BOOL
#undef CONF_DONT_CHECK_MIN
#undef CONF_CHECK_MIN
#undef CONF_DONT_CHECK_MAX
#undef CONF_CHECK_MAX
#undef CONF_HANDLE_T_U
#undef CONF_HANDLE_UNSIGNED
#undef CONF_HANDLE_SIZE_T
#undef CONF_HANDLE_SSIZE_T
#undef CONF_HANDLE_CHAR_P
    /* Re-enable diagnostic "-Wtype-limits" */
    JEMALLOC_DIAGNOSTIC_POP
		}
		if (opt_abort_conf && had_conf_error) {
			malloc_abort_invalid_conf();
		}
	}
	atomic_store_b(&log_init_done, true, ATOMIC_RELEASE);
}